

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void a__GLTexureUpload3D(AGLTexture *tex,AGLTextureData *data,GLenum binding,A__GLTextureFormat tf)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  GLenum GVar6;
  void *local_80;
  GLenum glerror_1;
  GLenum glerror;
  void *to_upload;
  int is_subimage;
  int expand;
  int maxdepth;
  int maxheight;
  int maxwidth;
  GLenum binding_local;
  AGLTextureData *data_local;
  AGLTexture *tex_local;
  GLenum GStack_20;
  A__GLTextureFormat tf_local;
  
  iVar3 = data->x + data->width;
  iVar4 = data->y + data->height;
  iVar5 = data->z + data->depth;
  bVar1 = true;
  if ((iVar3 <= tex->width) && (bVar1 = true, iVar4 <= tex->height)) {
    bVar1 = tex->depth < iVar5;
  }
  bVar2 = true;
  if ((data->x < 1) && (bVar2 = true, data->y < 1)) {
    bVar2 = 0 < data->z;
  }
  if ((bVar2) || (data->pixels == (void *)0x0)) {
    local_80 = (void *)0x0;
  }
  else {
    local_80 = data->pixels;
  }
  if ((binding != 0x806f) && (binding != 0x8c1a)) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x418,"binding == GL_TEXTURE_3D || binding == GL_TEXTURE_2D_ARRAY");
    aAppTerminate(-1);
  }
  GStack_20 = tf.format;
  if ((bVar1) || (local_80 != (void *)0x0)) {
    glTexImage3D(binding,0,tf._0_8_ & 0xffffffff,iVar3,iVar4,iVar5,0,GStack_20,tf.type,local_80);
    GVar6 = glGetError();
    if (GVar6 != 0) {
      a__GlPrintError("/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1054: glTexImage3D(binding, 0, tf.internal, maxwidth, maxheight, maxdepth, 0, tf.format, tf.type, to_upload) returned "
                      ,GVar6);
      abort();
    }
    tex->width = iVar3;
    tex->height = iVar4;
    tex->depth = iVar5;
  }
  if (bVar2) {
    if (data->pixels == (void *)0x0) {
      aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                      "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                      ,0x425,"data->pixels");
      aAppTerminate(-1);
    }
    glTexSubImage3D(binding,0,data->x,data->y,data->z,data->width,data->height,data->depth,GStack_20
                    ,tf.type,data->pixels);
    GVar6 = glGetError();
    if (GVar6 != 0) {
      a__GlPrintError("/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h:1064: glTexSubImage3D(binding, 0, data->x, data->y, data->z, data->width, data->height, data->depth, tf.format, tf.type, data->pixels) returned "
                      ,GVar6);
      abort();
    }
  }
  return;
}

Assistant:

static void a__GLTexureUpload3D(AGLTexture *tex, const AGLTextureData *data, GLenum binding, struct A__GLTextureFormat tf) {
	const int maxwidth = data->x + data->width;
	const int maxheight = data->y + data->height;
	const int maxdepth = data->z + data->depth;

	const int expand = (maxwidth > tex->width)
		|| (maxheight > tex->height)
		|| (maxdepth > tex->depth);
	const int is_subimage = (data->x > 0 || data->y > 0 || data->z > 0);
	const void *const to_upload = (!is_subimage && data->pixels) ? data->pixels : NULL;

	ATTO_ASSERT(binding == GL_TEXTURE_3D || binding == GL_TEXTURE_2D_ARRAY);

	if (expand || to_upload) {
		AGL__CALL(glTexImage3D(binding, 0, tf.internal,
			maxwidth, maxheight, maxdepth, 0,
			tf.format, tf.type,
			to_upload));
		tex->width = maxwidth;
		tex->height = maxheight;
		tex->depth = maxdepth;
	}

	if (is_subimage) {
		ATTO_ASSERT(data->pixels);
		AGL__CALL(glTexSubImage3D(binding, 0,
			data->x, data->y, data->z, data->width, data->height, data->depth,
			tf.format, tf.type, data->pixels));
	}
}